

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

rx_status rx_handle_test_result
                    (rx_context *context,int result,char *file,int line,rx_severity severity,
                    char *failure_msg,char *diagnostic_msg)

{
  char *local_70;
  char *buf_2;
  char *buf_1;
  char *buf;
  size_t failure_count;
  rx_failure *failure;
  rx_summary *summary;
  char *pcStack_38;
  rx_status status;
  char *failure_msg_local;
  rx_severity severity_local;
  int line_local;
  char *file_local;
  rx_context *prStack_18;
  int result_local;
  rx_context *context_local;
  
  pcStack_38 = failure_msg;
  failure_msg_local._0_4_ = severity;
  failure_msg_local._4_4_ = line;
  _severity_local = file;
  file_local._4_4_ = result;
  prStack_18 = context;
  if (context == (rx_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x186e,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  if (context->summary == (rx_summary *)0x0) {
    __assert_fail("context->summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x186f,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  if (context->summary->failures == (rx_failure *)0x0) {
    __assert_fail("context->summary->failures != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1870,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1871,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  failure = (rx_failure *)context->summary;
  ((rx_summary *)failure)->assessed_count = ((rx_summary *)failure)->assessed_count + 1;
  if (result == 0) {
    summary._4_4_ =
         rx__test_failure_array_extend_back
                   ((rx_failure **)&failure_count,&((rx_summary *)failure)->failures,1);
    if (summary._4_4_ == RX_SUCCESS) {
      rx__test_failure_array_get_size((size_t *)&buf,*(rx_failure **)&failure[1].line);
      failure[1].file = buf;
      summary._4_4_ = rx__str_copy(&buf_1,_severity_local);
      if (summary._4_4_ == RX_SUCCESS) {
        *(char **)failure_count = buf_1;
      }
      else {
        rx__log(RX_LOG_LEVEL_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1891,"failed to allocate the file name for the test located at %s:%d\n",
                _severity_local,(ulong)failure_msg_local._4_4_);
        *(undefined8 *)failure_count = 0;
      }
      *(uint *)(failure_count + 8) = failure_msg_local._4_4_;
      *(rx_severity *)(failure_count + 0xc) = (rx_severity)failure_msg_local;
      if (pcStack_38 == (char *)0x0) {
        *(undefined8 *)(failure_count + 0x10) = 0;
      }
      else {
        summary._4_4_ = rx__str_copy(&buf_2,pcStack_38);
        if (summary._4_4_ == RX_SUCCESS) {
          *(char **)(failure_count + 0x10) = buf_2;
        }
        else {
          rx__log(RX_LOG_LEVEL_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x18a5,"failed to allocate the failure message for the test located at %s:%d\n",
                  _severity_local,(ulong)failure_msg_local._4_4_);
          *(undefined8 *)(failure_count + 0x10) = 0;
        }
      }
      if (diagnostic_msg == (char *)0x0) {
        *(undefined8 *)(failure_count + 0x18) = 0;
      }
      else {
        summary._4_4_ = rx__str_copy(&local_70,diagnostic_msg);
        if (summary._4_4_ == RX_SUCCESS) {
          *(char **)(failure_count + 0x18) = local_70;
        }
        else {
          rx__log(RX_LOG_LEVEL_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x18b6,
                  "failed to allocate the diagnostic message for the test located at %s:%d\n",
                  _severity_local,(ulong)failure_msg_local._4_4_);
          *(undefined8 *)(failure_count + 0x18) = 0;
        }
      }
      context_local._4_4_ = RX_SUCCESS;
    }
    else {
      failure->msg = "failed to extend the test failure array";
      rx__log(RX_LOG_LEVEL_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
              ,0x1882,"failed to extend the test failure array for the test located at %s:%d\n",
              _severity_local,(ulong)failure_msg_local._4_4_);
      context_local._4_4_ = summary._4_4_;
    }
  }
  else {
    context_local._4_4_ = RX_SUCCESS;
  }
  return context_local._4_4_;
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE enum rx_status
rx_handle_test_result(struct rx_context *context,
                      int result,
                      const char *file,
                      int line,
                      enum rx_severity severity,
                      const char *failure_msg,
                      const char *diagnostic_msg)
{
    enum rx_status status;
    struct rx_summary *summary;
    struct rx_failure *failure;
    size_t failure_count;

    RX_ASSERT(context != NULL);
    RX_ASSERT(context->summary != NULL);
    RX_ASSERT(context->summary->failures != NULL);
    RX_ASSERT(file != NULL);

    summary = context->summary;

    ++summary->assessed_count;

    if (result) {
        return RX_SUCCESS;
    }

    status
        = rx__test_failure_array_extend_back(&failure, &summary->failures, 1);
    if (status != RX_SUCCESS) {
        summary->error = "failed to extend the test failure array\0";
        RX__LOG_ERROR_2("failed to extend the test failure array for the test "
                        "located at %s:%d\n",
                        file,
                        line);
        return status;
    }

    rx__test_failure_array_get_size(&failure_count, summary->failures);
    summary->failure_count = failure_count;

    {
        char *buf;

        status = rx__str_copy(&buf, file);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the file name for the test "
                            "located at %s:%d\n",
                            file,
                            line);
            failure->file = NULL;
        } else {
            failure->file = buf;
        }
    }

    failure->line = line;
    failure->severity = severity;

    if (failure_msg == NULL) {
        failure->msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, failure_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the failure message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->msg = NULL;
        } else {
            failure->msg = buf;
        }
    }

    if (diagnostic_msg == NULL) {
        failure->diagnostic_msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, diagnostic_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the diagnostic message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->diagnostic_msg = NULL;
        } else {
            failure->diagnostic_msg = buf;
        }
    }

    return RX_SUCCESS;
}